

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  size_type sVar2;
  int iVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  undefined8 uVar4;
  string subfolder;
  string local_90;
  string local_70;
  string local_50;
  
  progname = *argv;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  while( true ) {
    iVar3 = getopt(argc,argv,"K:vh");
    sVar2 = local_90._M_string_length;
    pcVar1 = _optarg;
    if (iVar3 != 0x4b) break;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar2,(ulong)pcVar1);
  }
  if (iVar3 == -1) {
    if ((char *)local_90._M_string_length != (char *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      initstreams(&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      summaryindex::doit(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      return 0;
    }
  }
  else {
    if (iVar3 == 0x76) {
      main_cold_1();
    }
    main_cold_4();
  }
  main_cold_3();
  uVar4 = extraout_RAX;
  if (extraout_EDX == 1) {
    main_cold_2();
    if ((string *)local_70._M_dataplus._M_p != &local_90) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    uVar4 = extraout_RAX_00;
    if (local_50._M_dataplus._M_p != "K:vh") {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

int main(int argc, char* argv[])
{
	progname = argv[0];
	std::string subfolder;
	int opt;
	while ((opt = getopt(argc, argv, (char *)"K:vh")) != -1) {
		switch (opt) {
		case 'v':
			fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
			exit(EXIT_FAILURE);
			break;
		case 'K':
			subfolder = optarg;
			break;
		case 'h':
		default:
			help();
			exit(EXIT_FAILURE);
		}
	}
	if (subfolder.length() == 0) {
		fprintf(stderr, "FATAL: No folder supplied for summarycalc files\n");
		exit(EXIT_FAILURE);
	}

	initstreams();
	try {
		summaryindex::doit(subfolder);
	}
	catch (std::bad_alloc&) {
		fprintf(stderr, "FATAL: %s: Memory allocation failed\n", progname);
		exit(EXIT_FAILURE);
	}
	return EXIT_SUCCESS;
}